

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mul.c
# Opt level: O0

void bn_mul_normal(unsigned_long *r,unsigned_long *a,int na,unsigned_long *b,int nb)

{
  ulong uVar1;
  ulong *in_RCX;
  int in_EDX;
  ulong *in_RSI;
  ulong *in_RDI;
  int in_R8D;
  unsigned_long *ltmp;
  int itmp;
  unsigned_long *rr;
  ulong *local_30;
  int local_24;
  ulong *local_20;
  int local_14;
  ulong *local_10;
  ulong *local_8;
  
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  if (in_EDX < in_R8D) {
    local_24 = in_EDX;
    local_20 = in_RSI;
    local_14 = in_R8D;
    local_10 = in_RCX;
  }
  local_30 = in_RDI + local_14;
  if (local_24 < 1) {
    bn_mul_words(in_RDI,local_10,local_14,0);
  }
  else {
    uVar1 = bn_mul_words(in_RDI,local_10,local_14,*local_20);
    *local_30 = uVar1;
    local_8 = in_RDI;
    while (0 < local_24 + -1) {
      uVar1 = bn_mul_add_words(local_8 + 1,local_10,local_14,local_20[1]);
      local_30[1] = uVar1;
      if (local_24 + -2 < 1) {
        return;
      }
      uVar1 = bn_mul_add_words(local_8 + 2,local_10,local_14,local_20[2]);
      local_30[2] = uVar1;
      if (local_24 + -3 < 1) {
        return;
      }
      uVar1 = bn_mul_add_words(local_8 + 3,local_10,local_14,local_20[3]);
      local_30[3] = uVar1;
      local_24 = local_24 + -4;
      if (local_24 < 1) {
        return;
      }
      uVar1 = bn_mul_add_words(local_8 + 4,local_10,local_14,local_20[4]);
      local_30[4] = uVar1;
      local_30 = local_30 + 4;
      local_8 = local_8 + 4;
      local_20 = local_20 + 4;
    }
  }
  return;
}

Assistant:

void bn_mul_normal(BN_ULONG *r, BN_ULONG *a, int na, BN_ULONG *b, int nb)
{
    BN_ULONG *rr;

    if (na < nb) {
        int itmp;
        BN_ULONG *ltmp;

        itmp = na;
        na = nb;
        nb = itmp;
        ltmp = a;
        a = b;
        b = ltmp;

    }
    rr = &(r[na]);
    if (nb <= 0) {
        (void)bn_mul_words(r, a, na, 0);
        return;
    } else
        rr[0] = bn_mul_words(r, a, na, b[0]);

    for (;;) {
        if (--nb <= 0)
            return;
        rr[1] = bn_mul_add_words(&(r[1]), a, na, b[1]);
        if (--nb <= 0)
            return;
        rr[2] = bn_mul_add_words(&(r[2]), a, na, b[2]);
        if (--nb <= 0)
            return;
        rr[3] = bn_mul_add_words(&(r[3]), a, na, b[3]);
        if (--nb <= 0)
            return;
        rr[4] = bn_mul_add_words(&(r[4]), a, na, b[4]);
        rr += 4;
        r += 4;
        b += 4;
    }
}